

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

int ctemplate::TemplateDictionary::StringAppendV
              (char *space,char **out,char *format,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  ulong __maxlen;
  va_list backup_ap;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = ap->reg_save_area;
  local_48._0_4_ = ap->gp_offset;
  local_48._4_4_ = ap->fp_offset;
  pvStack_40 = ap->overflow_arg_area;
  uVar2 = vsnprintf(space,0x400,format,&local_48);
  if (0x3ff < uVar2) {
    __maxlen = 0x400;
    while( true ) {
      uVar1 = uVar2 + 1;
      if ((int)uVar2 < 0) {
        uVar1 = (int)__maxlen * 2;
      }
      __maxlen = (ulong)uVar1;
      space = (char *)operator_new__(__maxlen);
      local_48._0_4_ = ap->gp_offset;
      local_48._4_4_ = ap->fp_offset;
      pvStack_40 = ap->overflow_arg_area;
      local_38 = ap->reg_save_area;
      uVar2 = vsnprintf(space,__maxlen,format,&local_48);
      if (-1 < (int)uVar2 && (int)uVar2 < (int)uVar1) break;
      operator_delete__(space);
    }
  }
  *out = space;
  return uVar2;
}

Assistant:

int TemplateDictionary::StringAppendV(char* space, char** out,
                                      const char* format, va_list ap) {
  const int kBufsize = 1024;
  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, kBufsize, format, backup_ap);
  va_end(backup_ap);

  if ((result >= 0) && (result < kBufsize)) {
    *out = space;
    return result;  // It fit
  }

  // Repeatedly increase buffer size until it fits
  int length = kBufsize;
  while (true) {
    if (result < 0) {
      // Older snprintf() behavior. :-(  Just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "result+1" characters
      length = result+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
    result = vsnprintf(buf, length, format, backup_ap);
    va_end(backup_ap);

    if ((result >= 0) && (result < length)) {
      *out = buf;
      return result;
    }
    delete[] buf;
  }
}